

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10,
          StringTree *params_11,ArrayPtr<const_char> *params_12)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_d0;
  StringTree *local_b8;
  StringTree *local_b0;
  StringTree *local_a8;
  ArrayPtr<const_char> *local_a0;
  size_t local_98;
  size_t sStack_90;
  char *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_98 = this->size_;
  sStack_90 = params->size_;
  local_88 = (params_1->text).content.ptr;
  sStack_80 = params_2->size_;
  local_78 = params_3->size_;
  sStack_70 = params_4->size_;
  local_68 = params_5->size_;
  sStack_60 = params_6->size_;
  local_58 = params_7->size_;
  local_50 = params_8->ptr;
  local_48 = (params_9->text).content.ptr;
  local_40 = params_10->ptr;
  local_38 = (params_11->text).content.ptr;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0xd;
  local_b8 = this;
  local_b0 = params;
  sVar1 = _::sum((_ *)&local_98,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_98 = 0;
  sStack_90 = 0;
  local_88 = (params_1->text).content.ptr;
  sStack_80 = params_2->size_;
  local_78 = params_3->size_;
  sStack_70 = params_4->size_;
  local_68 = params_5->size_;
  sStack_60 = params_6->size_;
  local_58 = params_7->size_;
  local_50 = (char *)0x0;
  local_48 = (params_9->text).content.ptr;
  local_40 = (char *)0x0;
  local_38 = (params_11->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xd;
  local_a8 = params_1;
  local_a0 = params_2;
  sVar1 = _::sum((_ *)&local_98,nums_00);
  heapString((String *)&local_d0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_d0);
  Array<char>::~Array((Array<char> *)&local_d0);
  local_98 = 1;
  sStack_90 = 1;
  local_88 = (char *)0x0;
  sStack_80 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  local_50 = (char *)0x1;
  local_48 = (char *)0x0;
  local_40 = (char *)0x1;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xd;
  sVar1 = _::sum((_ *)&local_98,nums_01);
  local_d0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_d0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_d0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_d0);
  Array<kj::StringTree::Branch>::~Array(&local_d0);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_b8,local_b0,(ArrayPtr<const_char> *)local_a8,
             local_a0,params_3,params_4,params_5,params_6,params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}